

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O3

dropt_error parse_option_arg(dropt_context *context,parse_state *ps)

{
  dropt_error dVar1;
  dropt_char *pdVar2;
  dropt_option *option;
  
  option = ps->option;
  pdVar2 = ps->optionArgument;
  if (pdVar2 != (dropt_char *)0x0 || option->arg_description == (dropt_char *)0x0) {
LAB_00103530:
    dVar1 = set_option_value(context,option,pdVar2);
    return dVar1;
  }
  if ((ps->argsLeft < 1) || (pdVar2 = *ps->argNext, pdVar2 == (dropt_char *)0x0)) {
    dVar1 = 5;
    if ((option->attr & 4) != 0) {
      pdVar2 = (dropt_char *)0x0;
      goto LAB_00103530;
    }
  }
  else {
    ps->optionArgument = pdVar2;
    dVar1 = set_option_value(context,option,pdVar2);
    if (dVar1 == 0) {
      ps->argNext = ps->argNext + 1;
      ps->argsLeft = ps->argsLeft + -1;
      dVar1 = 0;
    }
    else {
      option = ps->option;
      if (((option->attr & 4) != 0) && (ps->optionArgument != (dropt_char *)0x0)) {
        ps->optionArgument = (dropt_char *)0x0;
        pdVar2 = (dropt_char *)0x0;
        goto LAB_00103530;
      }
    }
  }
  return dVar1;
}

Assistant:

static dropt_error
parse_option_arg(dropt_context* context, parse_state* ps)
{
    dropt_error err;

    bool consumeNextArg = false;

    if (OPTION_TAKES_ARG(ps->option) && ps->optionArgument == NULL)
    {
        /* The option expects an argument, but none was specified with '='.
         * Try using the next item from the command-line.
         */
        if (ps->argsLeft > 0 && *(ps->argNext) != NULL)
        {
            consumeNextArg = true;
            ps->optionArgument = *(ps->argNext);
        }
        else if (!(ps->option->attr & dropt_attr_optional_val))
        {
            err = dropt_error_insufficient_arguments;
            goto exit;
        }
    }

    /* Even for options that don't ask for arguments, always parse and
     * consume an argument that was specified with '='.
     */
    err = set_option_value(context, ps->option, ps->optionArgument);

    if (   err != dropt_error_none
        && (ps->option->attr & dropt_attr_optional_val)
        && consumeNextArg
        && ps->optionArgument != NULL)
    {
        /* The option's handler didn't like the argument we fed it.  If the
         * argument was optional, try again without it.
         */
        consumeNextArg = false;
        ps->optionArgument = NULL;
        err = set_option_value(context, ps->option, NULL);
    }

exit:
    if (err == dropt_error_none && consumeNextArg)
    {
        ps->argNext++;
        ps->argsLeft--;
    }
    return err;
}